

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

int xSAT_SolverClaCalcLBD2(xSAT_Solver_t *s,Vec_Int_t *vLits)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  int i;
  
  s->nStamp = s->nStamp + 1;
  iVar3 = 0;
  for (i = 0; i < vLits->nSize; i = i + 1) {
    p = s->vLevels;
    iVar1 = Vec_IntEntry(vLits,i);
    iVar1 = Vec_IntEntry(p,iVar1 >> 1);
    uVar2 = Vec_IntEntry(s->vStamp,iVar1);
    if (uVar2 != s->nStamp) {
      Vec_IntWriteEntry(s->vStamp,iVar1,s->nStamp);
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

static inline int xSAT_SolverClaCalcLBD2( xSAT_Solver_t * s, Vec_Int_t * vLits )
{
    int i;
    int nLBD = 0;

    s->nStamp++;
    for ( i = 0; i < Vec_IntSize( vLits ); i++ )
    {
        int Level = Vec_IntEntry( s->vLevels, xSAT_Lit2Var( Vec_IntEntry( vLits, i ) ) );
        if ( ( unsigned ) Vec_IntEntry( s->vStamp, Level ) != s->nStamp )
        {
            Vec_IntWriteEntry( s->vStamp, Level, ( int ) s->nStamp );
            nLBD++;
        }
    }
    return nLBD;
}